

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O0

spv_result_t
spvtools::val::FindCaseFallThrough
          (ValidationState_t *_,BasicBlock *target_block,uint32_t *case_fall_through,
          Construct *switch_construct,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *case_targets)

{
  BasicBlock *pBVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  BasicBlock *pBVar5;
  reference ppBVar6;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *this;
  reference ppBVar7;
  size_type sVar8;
  Instruction *pIVar9;
  DiagnosticStream *pDVar10;
  pair<std::__detail::_Node_iterator<const_spvtools::val::BasicBlock_*,_true,_false>,_bool> pVar11;
  string local_540;
  string local_520;
  string local_500;
  DiagnosticStream local_4e0;
  undefined4 local_304;
  string local_300;
  string local_2e0;
  DiagnosticStream local_2c0;
  uint32_t local_e4;
  BasicBlock *local_e0;
  BasicBlock *successor;
  iterator __end4;
  iterator __begin4;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *__range4;
  BasicBlock *local_a0;
  value_type block;
  undefined1 local_90 [7];
  bool target_reachable;
  unordered_set<const_spvtools::val::BasicBlock_*,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<const_spvtools::val::BasicBlock_*>_>
  visited;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> stack;
  BasicBlock *merge;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *case_targets_local;
  Construct *switch_construct_local;
  uint32_t *case_fall_through_local;
  BasicBlock *target_block_local;
  ValidationState_t *__local;
  
  case_fall_through_local = &target_block->id_;
  target_block_local = (BasicBlock *)_;
  pBVar5 = Construct::exit_block(switch_construct);
  std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::vector
            ((vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *)
             &visited._M_h._M_single_bucket);
  std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::push_back
            ((vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *)
             &visited._M_h._M_single_bucket,(value_type *)&case_fall_through_local);
  std::
  unordered_set<const_spvtools::val::BasicBlock_*,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<const_spvtools::val::BasicBlock_*>_>
  ::unordered_set((unordered_set<const_spvtools::val::BasicBlock_*,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                   *)local_90);
  block._7_1_ = BasicBlock::structurally_reachable((BasicBlock *)case_fall_through_local);
LAB_00ae1bff:
  do {
    while( true ) {
      while( true ) {
        do {
          bVar2 = std::
                  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                  ::empty((vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                           *)&visited._M_h._M_single_bucket);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            __local._4_4_ = SPV_SUCCESS;
            goto LAB_00ae20aa;
          }
          ppBVar6 = std::
                    vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                    ::back((vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                            *)&visited._M_h._M_single_bucket);
          local_a0 = *ppBVar6;
          std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
          pop_back((vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                    *)&visited._M_h._M_single_bucket);
        } while ((local_a0 == pBVar5) ||
                (pVar11 = std::
                          unordered_set<const_spvtools::val::BasicBlock_*,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                          ::insert((unordered_set<const_spvtools::val::BasicBlock_*,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                                    *)local_90,&local_a0), ((pVar11.second ^ 0xffU) & 1) != 0));
        if (((block._7_1_ & 1) == 0) ||
           ((bVar2 = BasicBlock::structurally_reachable(local_a0), !bVar2 ||
            (bVar2 = BasicBlock::structurally_dominates
                               ((BasicBlock *)case_fall_through_local,local_a0), !bVar2)))) break;
        this = BasicBlock::successors(local_a0);
        __end4 = std::
                 vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
                 begin(this);
        successor = (BasicBlock *)
                    std::
                    vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                    ::end(this);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<spvtools::val::BasicBlock_**,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
                                           *)&successor), bVar2) {
          ppBVar7 = __gnu_cxx::
                    __normal_iterator<spvtools::val::BasicBlock_**,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
                    ::operator*(&__end4);
          local_e0 = *ppBVar7;
          std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
          push_back((vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                     *)&visited._M_h._M_single_bucket,&local_e0);
          __gnu_cxx::
          __normal_iterator<spvtools::val::BasicBlock_**,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
          ::operator++(&__end4);
        }
      }
      local_e4 = BasicBlock::id(local_a0);
      sVar8 = std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::count(case_targets,&local_e4);
      if (sVar8 != 0) break;
      bVar2 = Construct::IsStructuredExit
                        (switch_construct,(ValidationState_t *)target_block_local,local_a0);
      pBVar1 = target_block_local;
      if (!bVar2) {
        pIVar9 = BasicBlock::label((BasicBlock *)case_fall_through_local);
        ValidationState_t::diag(&local_2c0,(ValidationState_t *)pBVar1,SPV_ERROR_INVALID_CFG,pIVar9)
        ;
        pDVar10 = DiagnosticStream::operator<<
                            (&local_2c0,(char (*) [29])"Case construct that targets ");
        pBVar5 = target_block_local;
        uVar3 = BasicBlock::id((BasicBlock *)case_fall_through_local);
        ValidationState_t::getIdName_abi_cxx11_(&local_2e0,(ValidationState_t *)pBVar5,uVar3);
        pDVar10 = DiagnosticStream::operator<<(pDVar10,&local_2e0);
        pDVar10 = DiagnosticStream::operator<<
                            (pDVar10,(char (*) [30])" has invalid branch to block ");
        pBVar5 = target_block_local;
        uVar3 = BasicBlock::id(local_a0);
        ValidationState_t::getIdName_abi_cxx11_(&local_300,(ValidationState_t *)pBVar5,uVar3);
        pDVar10 = DiagnosticStream::operator<<(pDVar10,&local_300);
        pDVar10 = DiagnosticStream::operator<<
                            (pDVar10,(char (*) [92])
                                     " (not another case construct, corresponding merge, outer loop merge or outer loop continue)"
                            );
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
        std::__cxx11::string::~string((string *)&local_300);
        std::__cxx11::string::~string((string *)&local_2e0);
        DiagnosticStream::~DiagnosticStream(&local_2c0);
LAB_00ae20aa:
        local_304 = 1;
        std::
        unordered_set<const_spvtools::val::BasicBlock_*,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<const_spvtools::val::BasicBlock_*>_>
        ::~unordered_set((unordered_set<const_spvtools::val::BasicBlock_*,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                          *)local_90);
        std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
        ~vector((vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *
                )&visited._M_h._M_single_bucket);
        return __local._4_4_;
      }
    }
    if (*case_fall_through == 0) {
      if ((BasicBlock *)case_fall_through_local != local_a0) {
        uVar3 = BasicBlock::id(local_a0);
        *case_fall_through = uVar3;
      }
      goto LAB_00ae1bff;
    }
    uVar3 = *case_fall_through;
    uVar4 = BasicBlock::id(local_a0);
    pBVar1 = target_block_local;
    if (uVar3 != uVar4) {
      pIVar9 = BasicBlock::label((BasicBlock *)case_fall_through_local);
      ValidationState_t::diag(&local_4e0,(ValidationState_t *)pBVar1,SPV_ERROR_INVALID_CFG,pIVar9);
      pDVar10 = DiagnosticStream::operator<<
                          (&local_4e0,(char (*) [29])"Case construct that targets ");
      pBVar5 = target_block_local;
      uVar3 = BasicBlock::id((BasicBlock *)case_fall_through_local);
      ValidationState_t::getIdName_abi_cxx11_(&local_500,(ValidationState_t *)pBVar5,uVar3);
      pDVar10 = DiagnosticStream::operator<<(pDVar10,&local_500);
      pDVar10 = DiagnosticStream::operator<<
                          (pDVar10,(char (*) [56])
                                   " has branches to multiple other case construct targets ");
      ValidationState_t::getIdName_abi_cxx11_
                (&local_520,(ValidationState_t *)target_block_local,*case_fall_through);
      pDVar10 = DiagnosticStream::operator<<(pDVar10,&local_520);
      pDVar10 = DiagnosticStream::operator<<(pDVar10,(char (*) [6])0xf44f16);
      pBVar5 = target_block_local;
      uVar3 = BasicBlock::id(local_a0);
      ValidationState_t::getIdName_abi_cxx11_(&local_540,(ValidationState_t *)pBVar5,uVar3);
      pDVar10 = DiagnosticStream::operator<<(pDVar10,&local_540);
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
      std::__cxx11::string::~string((string *)&local_540);
      std::__cxx11::string::~string((string *)&local_520);
      std::__cxx11::string::~string((string *)&local_500);
      DiagnosticStream::~DiagnosticStream(&local_4e0);
      goto LAB_00ae20aa;
    }
  } while( true );
}

Assistant:

spv_result_t FindCaseFallThrough(
    ValidationState_t& _, BasicBlock* target_block, uint32_t* case_fall_through,
    const Construct& switch_construct,
    const std::unordered_set<uint32_t>& case_targets) {
  const auto* merge = switch_construct.exit_block();
  std::vector<BasicBlock*> stack;
  stack.push_back(target_block);
  std::unordered_set<const BasicBlock*> visited;
  bool target_reachable = target_block->structurally_reachable();
  while (!stack.empty()) {
    auto block = stack.back();
    stack.pop_back();

    if (block == merge) continue;

    if (!visited.insert(block).second) continue;

    if (target_reachable && block->structurally_reachable() &&
        target_block->structurally_dominates(*block)) {
      // Still in the case construct.
      for (auto successor : *block->successors()) {
        stack.push_back(successor);
      }
    } else {
      // Exiting the case construct to non-merge block.
      if (!case_targets.count(block->id())) {
        // We have already filtered out the following:
        //  * The switch's merge
        //  * Other case targets
        //  * Blocks in the same case construct
        //
        // So the only remaining valid branches are the structured exits from
        // the overall selection construct of the switch.
        if (switch_construct.IsStructuredExit(_, block)) {
          continue;
        }

        return _.diag(SPV_ERROR_INVALID_CFG, target_block->label())
               << "Case construct that targets "
               << _.getIdName(target_block->id())
               << " has invalid branch to block " << _.getIdName(block->id())
               << " (not another case construct, corresponding merge, outer "
                  "loop merge or outer loop continue)";
      }

      if (*case_fall_through == 0u) {
        if (target_block != block) {
          *case_fall_through = block->id();
        }
      } else if (*case_fall_through != block->id()) {
        // Case construct has at most one branch to another case construct.
        return _.diag(SPV_ERROR_INVALID_CFG, target_block->label())
               << "Case construct that targets "
               << _.getIdName(target_block->id())
               << " has branches to multiple other case construct targets "
               << _.getIdName(*case_fall_through) << " and "
               << _.getIdName(block->id());
      }
    }
  }

  return SPV_SUCCESS;
}